

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

json __thiscall Player::serializeHand_abi_cxx11_(Player *this)

{
  bool bVar1;
  reference ppCVar2;
  json_value extraout_RDX;
  long in_RSI;
  json jVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_50;
  Card *local_40;
  Card *c;
  iterator __end1;
  iterator __begin1;
  vector<Card_*,_std::allocator<Card_*>_> *__range1;
  Player *this_local;
  json *hand;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)this,(nullptr_t)0x0);
  __end1 = std::vector<Card_*,_std::allocator<Card_*>_>::begin
                     ((vector<Card_*,_std::allocator<Card_*>_> *)(in_RSI + 8));
  c = (Card *)std::vector<Card_*,_std::allocator<Card_*>_>::end
                        ((vector<Card_*,_std::allocator<Card_*>_> *)(in_RSI + 8));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>
                                     *)&c), bVar1) {
    ppCVar2 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
              operator*(&__end1);
    local_40 = *ppCVar2;
    (**(local_40->super_Serializable)._vptr_Serializable)(&local_50);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator+=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)this,&local_50);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_50);
    __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::operator++
              (&__end1);
  }
  jVar3.m_value.object = extraout_RDX.object;
  jVar3._0_8_ = this;
  return jVar3;
}

Assistant:

json Player::serializeHand() {
    json hand;
    for (auto c: _hand) {
        hand += c->serialize();
    }
    return hand;
}